

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal_simd.c
# Opt level: O2

void FAudio_INTERNAL_Mix_Generic_SSE2
               (uint32_t toMix,uint32_t srcChans,uint32_t dstChans,float *src,float *dst,
               float *coefficients)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t uVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  
  uVar3 = (ulong)srcChans;
  for (uVar6 = 0; uVar6 != toMix; uVar6 = uVar6 + 1) {
    uVar7 = 0;
    for (uVar4 = 0; uVar4 != dstChans; uVar4 = uVar4 + 1) {
      uVar5 = uVar7 & 0xffffffff;
      uVar10 = 0;
      pfVar9 = src;
      for (uVar8 = uVar3; 3 < uVar8; uVar8 = uVar8 - 4) {
        pfVar1 = coefficients + (uint)((int)uVar7 + (int)uVar10);
        pfVar2 = src + uVar10;
        dst[uVar4] = pfVar2[3] * pfVar1[3] + pfVar2[2] * pfVar1[2] +
                     pfVar2[1] * pfVar1[1] + *pfVar2 * *pfVar1 + dst[uVar4];
        uVar10 = uVar10 + 4;
        pfVar9 = pfVar9 + 4;
        uVar5 = (ulong)((int)uVar5 + 4);
      }
      for (; uVar10 < uVar3; uVar10 = uVar10 + 1) {
        dst[uVar4] = *pfVar9 * coefficients[uVar5] + dst[uVar4];
        pfVar9 = pfVar9 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      uVar7 = uVar7 + uVar3;
    }
    dst = dst + dstChans;
    src = src + uVar3;
  }
  return;
}

Assistant:

void FAudio_INTERNAL_Mix_Generic_SSE2(
	uint32_t toMix,
	uint32_t srcChans,
	uint32_t dstChans,
	float *restrict src,
	float *restrict dst,
	float *restrict coefficients
) {
	uint32_t i, co, ci;
	for (i = 0; i < toMix; i += 1, src += srcChans, dst += dstChans)
	for (co = 0; co < dstChans; co += 1)
	{
		for (ci = 0; srcChans - ci >= 4; ci += 4)
		{
			/* do SIMD */
			const __m128 vols = _mm_loadu_ps(&coefficients[co * srcChans + ci]);
			const __m128 dat = _mm_loadu_ps(&src[ci]);
			dst[co] += FAudio_simd_hadd(_mm_mul_ps(dat, vols));
		}

		for (; ci < srcChans; ci += 1)
		{
			/* do scalar */
			dst[co] += (
				src[ci] *
				coefficients[co * srcChans + ci]
			);
		}
	}
}